

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.hpp
# Opt level: O0

unique_ptr<Catch::Detail::(anonymous_namespace)::CoutStream>
Catch::Detail::make_unique<Catch::Detail::(anonymous_namespace)::CoutStream>(void)

{
  CoutStream *ptr;
  CoutStream *in_RDI;
  CoutStream *in_stack_fffffffffffffff0;
  
  ptr = (CoutStream *)operator_new(0x118);
  anon_unknown_3::CoutStream::CoutStream(in_stack_fffffffffffffff0);
  unique_ptr<Catch::Detail::(anonymous_namespace)::CoutStream>::unique_ptr
            ((unique_ptr<Catch::Detail::(anonymous_namespace)::CoutStream> *)in_RDI,ptr);
  return (unique_ptr<Catch::Detail::(anonymous_namespace)::CoutStream>)in_RDI;
}

Assistant:

unique_ptr<T> make_unique(Args&&... args) {
        return unique_ptr<T>(new T(CATCH_FORWARD(args)...));
    }